

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O2

void Hop_ManDfs_rec(Hop_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  void **ppvVar1;
  uint uVar2;
  char *__assertion;
  int iVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assertion = "!Hop_IsComplement(pObj)";
    uVar2 = 0x2f;
LAB_005fd2b6:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopDfs.c"
                  ,uVar2,"void Hop_ManDfs_rec(Hop_Obj_t *, Vec_Ptr_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 4) {
    Hop_ManDfs_rec((Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
    Hop_ManDfs_rec((Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vNodes);
    if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
      __assertion = "!Hop_ObjIsMarkA(pObj)";
      uVar2 = 0x34;
      goto LAB_005fd2b6;
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
    iVar3 = vNodes->nSize;
    if (iVar3 == vNodes->nCap) {
      uVar2 = 0x10;
      if (0xf < iVar3) {
        uVar2 = iVar3 * 2;
      }
      if (iVar3 < (int)uVar2) {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar1 = (void **)malloc((ulong)uVar2 << 3);
        }
        else {
          ppvVar1 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 3);
          iVar3 = vNodes->nSize;
        }
        vNodes->pArray = ppvVar1;
        vNodes->nCap = uVar2;
      }
    }
    vNodes->nSize = iVar3 + 1;
    vNodes->pArray[iVar3] = pObj;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects internal nodes in the DFS order.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Hop_ManDfs_rec( Hop_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Hop_ManDfs_rec( Hop_ObjFanin0(pObj), vNodes );
    Hop_ManDfs_rec( Hop_ObjFanin1(pObj), vNodes );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA(pObj);
    Vec_PtrPush( vNodes, pObj );
}